

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_control_impl.cc
# Opt level: O0

int16_t webrtc::anon_unknown_0::MapSetting(Mode mode)

{
  ostream *poVar1;
  FatalMessage local_190;
  FatalMessageVoidify local_11;
  Mode local_10;
  int16_t local_a;
  Mode mode_local;
  
  if (mode == kAdaptiveAnalog) {
    local_a = 1;
  }
  else if (mode == kAdaptiveDigital) {
    local_a = 2;
  }
  else {
    if (mode != kFixedDigital) {
      local_10 = mode;
      rtc::FatalMessageVoidify::FatalMessageVoidify(&local_11);
      rtc::FatalMessage::FatalMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/gain_control_impl.cc"
                 ,0x1f);
      poVar1 = rtc::FatalMessage::stream(&local_190);
      poVar1 = std::operator<<(poVar1,"Check failed: false");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<(poVar1,"# ");
      rtc::FatalMessageVoidify::operator&(&local_11,poVar1);
      rtc::FatalMessage::~FatalMessage(&local_190);
    }
    local_a = 3;
  }
  return local_a;
}

Assistant:

int16_t MapSetting(GainControl::Mode mode) {
  switch (mode) {
    case GainControl::kAdaptiveAnalog:
      return kAgcModeAdaptiveAnalog;
    case GainControl::kAdaptiveDigital:
      return kAgcModeAdaptiveDigital;
    case GainControl::kFixedDigital:
      return kAgcModeFixedDigital;
  }
  RTC_DCHECK(false);
  return -1;
}